

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_pack_s32_s16(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  c_v128 cVar8;
  
  auVar3 = vpinsrd_avx(ZEXT416(b.u32[3]),a.u32[2],1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a.u64[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b.u64[0];
  auVar4 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar1 = vpshufd_avx(auVar4,0xe8);
  auVar5 = vpsrlq_avx(auVar4,0x20);
  auVar4 = vpinsrd_avx(ZEXT416(b.u32[2]),a.u32[3],1);
  auVar6._8_4_ = 0xffff8000;
  auVar6._0_8_ = 0xffff8000ffff8000;
  auVar6._12_4_ = 0xffff8000;
  auVar2 = vpshufd_avx(auVar5,0xe8);
  auVar3 = vpmaxsd_avx(auVar3,auVar6);
  auVar7._8_4_ = 0x7fff;
  auVar7._0_8_ = 0x7fff00007fff;
  auVar7._12_4_ = 0x7fff;
  auVar5 = vpminsd_avx(auVar3,auVar7);
  auVar3 = vpmaxsd_avx(auVar4,auVar6);
  auVar4 = vpminsd_avx(auVar3,auVar7);
  auVar3 = vpmaxsd_avx(auVar2,auVar6);
  auVar2 = vpminsd_avx(auVar3,auVar7);
  auVar3 = vpmaxsd_avx(auVar1,auVar6);
  auVar1 = vpminsd_avx(auVar3,auVar7);
  auVar3 = vpblendw_avx(auVar5,(undefined1  [16])0x0,10);
  auVar3 = vpmovzxdq_avx(auVar3);
  auVar5 = vpsllvq_avx2(auVar3,_DAT_00c24a30);
  auVar3 = vpblendw_avx(auVar4,(undefined1  [16])0x0,10);
  auVar3 = vpmovzxdq_avx(auVar3);
  auVar3 = vpsllvq_avx2(auVar3,_DAT_00c24a40);
  auVar5 = vpor_avx(auVar3,auVar5);
  auVar3 = vpslld_avx(auVar2,0x10);
  auVar4 = vpmovzxdq_avx(auVar3);
  auVar3 = vpblendw_avx(auVar1,(undefined1  [16])0x0,10);
  auVar3 = vpmovzxdq_avx(auVar3);
  auVar3 = vpor_avx(auVar4,auVar3);
  auVar3 = vpor_avx(auVar5,auVar3);
  cVar8._8_8_ = vpextrq_avx(auVar3,1);
  cVar8.u64[0] = auVar3._0_8_;
  return cVar8;
}

Assistant:

SIMD_INLINE c_v128 c_v128_pack_s32_s16(c_v128 a, c_v128 b) {
  return c_v128_from_v64(c_v64_pack_s32_s16(a.v64[1], a.v64[0]),
                         c_v64_pack_s32_s16(b.v64[1], b.v64[0]));
}